

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colmatrix_test.cc
# Opt level: O0

void __thiscall
fizplex::ColMatrix_RowAndColCountEmptyMatrix_Test::TestBody
          (ColMatrix_RowAndColCountEmptyMatrix_Test *this)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  AssertionResult *this_00;
  char *in_R9;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  ColMatrix m;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  ColMatrix *in_stack_ffffffffffffff10;
  string local_d0;
  AssertHelper local_b0;
  Message local_a8;
  undefined1 local_99;
  AssertionResult local_98;
  string local_88;
  AssertHelper local_68;
  Message local_60 [3];
  undefined1 local_41;
  AssertionResult local_40;
  ColMatrix local_30;
  
  ColMatrix::ColMatrix(in_stack_ffffffffffffff10);
  sVar2 = ColMatrix::row_count(&local_30);
  local_41 = sVar2 == 0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffff10,
             (bool *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),(type *)0x1b8e0b)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_40);
  if (!bVar1) {
    testing::Message::Message(local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_88,(internal *)&local_40,(AssertionResult *)"m.row_count() == 0","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/colmatrix_test.cc"
               ,8,pcVar3);
    testing::internal::AssertHelper::operator=(&local_68,local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    testing::Message::~Message((Message *)0x1b8f01);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1b8f76);
  this_00 = (AssertionResult *)ColMatrix::col_count(&local_30);
  local_99 = this_00 == (AssertionResult *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            (this_00,(bool *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
             (type *)0x1b8faa);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d0,(internal *)&local_98,(AssertionResult *)"m.col_count() == 0","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/colmatrix_test.cc"
               ,9,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    testing::Message::~Message((Message *)0x1b9081);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1b90ed);
  ColMatrix::~ColMatrix((ColMatrix *)0x1b90fa);
  return;
}

Assistant:

TEST(ColMatrix, RowAndColCountEmptyMatrix) {
  const ColMatrix m;
  EXPECT_TRUE(m.row_count() == 0);
  EXPECT_TRUE(m.col_count() == 0);
}